

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_parse_dns(char *buf,int len,mg_dns_message *msg)

{
  uint16_t uVar1;
  int local_44;
  int i;
  uchar *end;
  uchar *data;
  mg_dns_header *header;
  mg_dns_message *msg_local;
  int len_local;
  char *buf_local;
  
  end = (uchar *)(buf + 0xc);
  (msg->pkt).p = buf;
  (msg->pkt).len = (long)len;
  if (len < 0xc) {
    buf_local._4_4_ = -1;
  }
  else {
    msg->transaction_id = *(uint16_t *)buf;
    uVar1 = ntohs(*(uint16_t *)(buf + 2));
    msg->flags = uVar1;
    uVar1 = ntohs(*(uint16_t *)(buf + 4));
    msg->num_questions = (uint)uVar1;
    uVar1 = ntohs(*(uint16_t *)(buf + 6));
    msg->num_answers = (uint)uVar1;
    for (local_44 = 0; local_44 < msg->num_questions && local_44 < 0x20; local_44 = local_44 + 1) {
      end = mg_parse_dns_resource_record(end,(uchar *)(buf + len),msg->questions + local_44,0);
    }
    for (local_44 = 0; local_44 < msg->num_answers && local_44 < 0x20; local_44 = local_44 + 1) {
      end = mg_parse_dns_resource_record(end,(uchar *)(buf + len),msg->answers + local_44,1);
    }
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int mg_parse_dns(const char *buf, int len, struct mg_dns_message *msg) {
    struct mg_dns_header *header = (struct mg_dns_header *) buf;
    unsigned char *data = (unsigned char *) buf + sizeof(*header);
    unsigned char *end = (unsigned char *) buf + len;
    int i;
    msg->pkt.p = buf;
    msg->pkt.len = len;

    if (len < (int) sizeof(*header)) {
        return -1; /* LCOV_EXCL_LINE */
    }

    msg->transaction_id = header->transaction_id;
    msg->flags = ntohs(header->flags);
    msg->num_questions = ntohs(header->num_questions);
    msg->num_answers = ntohs(header->num_answers);

    for (i = 0; i < msg->num_questions && i < (int) ARRAY_SIZE(msg->questions);
         i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->questions[i], 0);
    }

    for (i = 0; i < msg->num_answers && i < (int) ARRAY_SIZE(msg->answers); i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->answers[i], 1);
    }

    return 0;
}